

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

int l_strcmp(TString *ts1,TString *ts2)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char **local_68;
  char **local_60;
  size_t zl2;
  size_t zl1;
  char **ppcStack_40;
  int temp;
  char *s2;
  size_t rl2;
  char *s1;
  size_t rl1;
  TString *ts2_local;
  TString *ts1_local;
  
  if (ts1->shrlen < '\0') {
    s1 = (char *)(ts1->u).hnext;
    local_60 = (char **)ts1->contents;
  }
  else {
    s1 = (char *)(long)ts1->shrlen;
    local_60 = &ts1->contents;
  }
  rl2 = (size_t)local_60;
  if (ts2->shrlen < '\0') {
    s2 = (char *)(ts2->u).hnext;
    local_68 = (char **)ts2->contents;
  }
  else {
    s2 = (char *)(long)ts2->shrlen;
    local_68 = &ts2->contents;
  }
  ppcStack_40 = local_68;
  while( true ) {
    iVar1 = strcoll((char *)rl2,(char *)ppcStack_40);
    if (iVar1 != 0) {
      return iVar1;
    }
    pcVar2 = (char *)strlen((char *)rl2);
    pcVar3 = (char *)strlen((char *)ppcStack_40);
    if (pcVar3 == s2) break;
    if (pcVar2 == s1) {
      return -1;
    }
    rl2 = (size_t)(pcVar2 + 1 + rl2);
    s1 = s1 + -(long)(pcVar2 + 1);
    ppcStack_40 = (char **)(pcVar3 + 1 + (long)ppcStack_40);
    s2 = s2 + -(long)(pcVar3 + 1);
  }
  return (uint)(pcVar2 != s1);
}

Assistant:

static int l_strcmp (const TString *ts1, const TString *ts2) {
  size_t rl1;  /* real length */
  const char *s1 = getlstr(ts1, rl1);
  size_t rl2;
  const char *s2 = getlstr(ts2, rl2);
  for (;;) {  /* for each segment */
    int temp = strcoll(s1, s2);
    if (temp != 0)  /* not equal? */
      return temp;  /* done */
    else {  /* strings are equal up to a '\0' */
      size_t zl1 = strlen(s1);  /* index of first '\0' in 's1' */
      size_t zl2 = strlen(s2);  /* index of first '\0' in 's2' */
      if (zl2 == rl2)  /* 's2' is finished? */
        return (zl1 == rl1) ? 0 : 1;  /* check 's1' */
      else if (zl1 == rl1)  /* 's1' is finished? */
        return -1;  /* 's1' is less than 's2' ('s2' is not finished) */
      /* both strings longer than 'zl'; go on comparing after the '\0' */
      zl1++; zl2++;
      s1 += zl1; rl1 -= zl1; s2 += zl2; rl2 -= zl2;
    }
  }
}